

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void __thiscall
icu_63::DecimalFormat::DecimalFormat
          (DecimalFormat *this,DecimalFormatSymbols *symbolsToAdopt,UErrorCode *status)

{
  UBool UVar1;
  DecimalFormatFields *pDVar2;
  DecimalFormatProperties *pDVar3;
  DecimalFormatSymbols *pDVar4;
  DecimalFormatSymbols *local_d8;
  DecimalFormatProperties *local_b8;
  DecimalFormatProperties *local_a0;
  DecimalFormatFields *local_88;
  LocalPointerBase<const_icu_63::DecimalFormatSymbols> local_28;
  LocalPointer<const_icu_63::DecimalFormatSymbols> adoptedSymbols;
  UErrorCode *status_local;
  DecimalFormatSymbols *symbolsToAdopt_local;
  DecimalFormat *this_local;
  
  adoptedSymbols.super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr =
       (LocalPointerBase<const_icu_63::DecimalFormatSymbols>)
       (LocalPointerBase<const_icu_63::DecimalFormatSymbols>)status;
  NumberFormat::NumberFormat(&this->super_NumberFormat);
  (this->super_NumberFormat).super_Format.super_UObject._vptr_UObject =
       (_func_int **)&PTR__DecimalFormat_0049dd30;
  LocalPointer<const_icu_63::DecimalFormatSymbols>::LocalPointer
            ((LocalPointer<const_icu_63::DecimalFormatSymbols> *)&local_28,symbolsToAdopt);
  pDVar2 = (DecimalFormatFields *)UMemory::operator_new((UMemory *)0x8a8,(size_t)symbolsToAdopt);
  local_88 = (DecimalFormatFields *)0x0;
  if (pDVar2 != (DecimalFormatFields *)0x0) {
    symbolsToAdopt = (DecimalFormatSymbols *)0x0;
    memset(pDVar2,0,0x8a8);
    icu_63::number::impl::DecimalFormatFields::DecimalFormatFields(pDVar2);
    local_88 = pDVar2;
  }
  this->fields = local_88;
  UVar1 = ::U_FAILURE(*(UErrorCode *)
                       adoptedSymbols.super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr
                     );
  if (UVar1 == '\0') {
    if (this->fields == (DecimalFormatFields *)0x0) {
      *(undefined4 *)adoptedSymbols.super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr =
           7;
    }
    else {
      pDVar2 = this->fields;
      pDVar3 = (DecimalFormatProperties *)
               UMemory::operator_new((UMemory *)0x2f8,(size_t)symbolsToAdopt);
      local_a0 = (DecimalFormatProperties *)0x0;
      if (pDVar3 != (DecimalFormatProperties *)0x0) {
        icu_63::number::impl::DecimalFormatProperties::DecimalFormatProperties(pDVar3);
        local_a0 = pDVar3;
      }
      LocalPointer<icu_63::number::impl::DecimalFormatProperties>::adoptInsteadAndCheckErrorCode
                (&pDVar2->properties,local_a0,
                 (UErrorCode *)
                 adoptedSymbols.super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr);
      pDVar2 = this->fields;
      pDVar3 = (DecimalFormatProperties *)UMemory::operator_new((UMemory *)0x2f8,(size_t)local_a0);
      local_b8 = (DecimalFormatProperties *)0x0;
      if (pDVar3 != (DecimalFormatProperties *)0x0) {
        icu_63::number::impl::DecimalFormatProperties::DecimalFormatProperties(pDVar3);
        local_b8 = pDVar3;
      }
      LocalPointer<icu_63::number::impl::DecimalFormatProperties>::adoptInsteadAndCheckErrorCode
                (&pDVar2->exportedProperties,local_b8,
                 (UErrorCode *)
                 adoptedSymbols.super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr);
      UVar1 = LocalPointerBase<const_icu_63::DecimalFormatSymbols>::isNull(&local_28);
      if (UVar1 == '\0') {
        pDVar2 = this->fields;
        pDVar4 = LocalPointerBase<const_icu_63::DecimalFormatSymbols>::orphan(&local_28);
        LocalPointer<const_icu_63::DecimalFormatSymbols>::adoptInsteadAndCheckErrorCode
                  (&pDVar2->symbols,pDVar4,
                   (UErrorCode *)
                   adoptedSymbols.super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr);
      }
      else {
        pDVar2 = this->fields;
        pDVar4 = (DecimalFormatSymbols *)UMemory::operator_new((UMemory *)0xb00,(size_t)local_b8);
        local_d8 = (DecimalFormatSymbols *)0x0;
        if (pDVar4 != (DecimalFormatSymbols *)0x0) {
          DecimalFormatSymbols::DecimalFormatSymbols
                    (pDVar4,(UErrorCode *)
                            adoptedSymbols.
                            super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr);
          local_d8 = pDVar4;
        }
        LocalPointer<const_icu_63::DecimalFormatSymbols>::adoptInsteadAndCheckErrorCode
                  (&pDVar2->symbols,local_d8,
                   (UErrorCode *)
                   adoptedSymbols.super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr);
      }
    }
  }
  LocalPointer<const_icu_63::DecimalFormatSymbols>::~LocalPointer
            ((LocalPointer<const_icu_63::DecimalFormatSymbols> *)&local_28);
  return;
}

Assistant:

DecimalFormat::DecimalFormat(const DecimalFormatSymbols* symbolsToAdopt, UErrorCode& status) {
    LocalPointer<const DecimalFormatSymbols> adoptedSymbols(symbolsToAdopt);
    fields = new DecimalFormatFields();
    if (U_FAILURE(status)) {
        return;
    }
    if (fields == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    fields->properties.adoptInsteadAndCheckErrorCode(new DecimalFormatProperties(), status);
    fields->exportedProperties.adoptInsteadAndCheckErrorCode(new DecimalFormatProperties(), status);
    if (adoptedSymbols.isNull()) {
        fields->symbols.adoptInsteadAndCheckErrorCode(new DecimalFormatSymbols(status), status);
    } else {
        fields->symbols.adoptInsteadAndCheckErrorCode(adoptedSymbols.orphan(), status);
    }
}